

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_sectors.cpp
# Opt level: O3

double __thiscall sector_t::FindLowestCeilingSurrounding(sector_t_conflict *this,vertex_t **v)

{
  double dVar1;
  ushort uVar2;
  line_t_conflict *plVar3;
  vertex_t *pvVar4;
  vertex_t *pvVar5;
  double dVar6;
  double dVar7;
  vertex_t *pvVar8;
  ulong uVar9;
  sector_t_conflict *psVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  
  uVar2 = this->linecount;
  if ((ulong)uVar2 != 0) {
    pvVar8 = (*this->lines)->v1;
    dVar11 = 3.4028234663852886e+38;
    if (0 < (short)uVar2) {
      uVar9 = 0;
      do {
        plVar3 = this->lines[uVar9];
        if (((plVar3->flags & 4) != 0) &&
           (((psVar10 = plVar3->frontsector, psVar10 != this ||
             (psVar10 = plVar3->backsector, psVar10 != this)) &&
            (psVar10 != (sector_t_conflict *)0x0)))) {
          dVar1 = (psVar10->ceilingplane).D;
          dVar6 = (psVar10->ceilingplane).normal.X;
          dVar7 = (psVar10->ceilingplane).normal.Y;
          pvVar4 = plVar3->v1;
          pvVar5 = plVar3->v2;
          dVar12 = (psVar10->ceilingplane).negiC;
          dVar13 = ((pvVar4->p).Y * dVar7 + dVar1 + (pvVar4->p).X * dVar6) * dVar12;
          if (dVar13 < dVar11) {
            pvVar8 = pvVar4;
            dVar11 = dVar13;
          }
          dVar12 = ((pvVar5->p).Y * dVar7 + dVar1 + (pvVar5->p).X * dVar6) * dVar12;
          if (dVar12 < dVar11) {
            pvVar8 = pvVar5;
            dVar11 = dVar12;
          }
        }
        uVar9 = uVar9 + 1;
      } while (uVar2 != uVar9);
    }
    if (v != (vertex_t **)0x0) {
      *v = pvVar8;
    }
    return dVar11;
  }
  return this->planes[1].TexZ;
}

Assistant:

double sector_t::FindLowestCeilingSurrounding (vertex_t **v) const
{
	double height;
	double oceil;
	sector_t *other;
	vertex_t *spot;
	line_t *check;
	int i;

	if (linecount == 0) return GetPlaneTexZ(sector_t::ceiling);

	spot = lines[0]->v1;
	height = FLT_MAX;

	for (i = 0; i < linecount; i++)
	{
		check = lines[i];
		if (NULL != (other = getNextSector (check, this)))
		{
			oceil = other->ceilingplane.ZatPoint(check->v1);
			if (oceil < height)
			{
				height = oceil;
				spot = check->v1;
			}
			oceil = other->ceilingplane.ZatPoint(check->v2);
			if (oceil < height)
			{
				height = oceil;
				spot = check->v2;
			}
		}
	}
	if (v != NULL)
		*v = spot;
	return height;
}